

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_parse_url_path(Curl_easy *data,connectdata *conn)

{
  char *pcVar1;
  char *local_58;
  char *pcStack_40;
  CURLcode result;
  char *slash;
  char *path;
  smb_conn *smbc;
  smb_request *req;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  smbc = (smb_conn *)(data->req).p.file;
  path = (char *)&conn->proto;
  req = (smb_request *)conn;
  conn_local = (connectdata *)data;
  data_local._4_4_ = Curl_urldecode((data->state).up.path,0,&slash,(size_t *)0x0,REJECT_CTRL);
  if (data_local._4_4_ == CURLE_OK) {
    if ((*slash == '/') || (*slash == '\\')) {
      local_58 = slash + 1;
    }
    else {
      local_58 = slash;
    }
    pcVar1 = (*Curl_cstrdup)(local_58);
    *(char **)(path + 0x18) = pcVar1;
    (*Curl_cfree)(slash);
    if (*(long *)(path + 0x18) == 0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      pcStack_40 = strchr(*(char **)(path + 0x18),0x2f);
      if (pcStack_40 == (char *)0x0) {
        pcStack_40 = strchr(*(char **)(path + 0x18),0x5c);
      }
      if (pcStack_40 == (char *)0x0) {
        (*Curl_cfree)(*(void **)(path + 0x18));
        path[0x18] = '\0';
        path[0x19] = '\0';
        path[0x1a] = '\0';
        path[0x1b] = '\0';
        path[0x1c] = '\0';
        path[0x1d] = '\0';
        path[0x1e] = '\0';
        path[0x1f] = '\0';
        Curl_failf((Curl_easy *)conn_local,"missing share in URL path for SMB");
        data_local._4_4_ = CURLE_URL_MALFORMAT;
      }
      else {
        *pcStack_40 = '\0';
        smbc->user = pcStack_40 + 1;
        for (pcStack_40 = pcStack_40 + 1; *pcStack_40 != '\0'; pcStack_40 = pcStack_40 + 1) {
          if (*pcStack_40 == '/') {
            *pcStack_40 = '\\';
          }
        }
        data_local._4_4_ = CURLE_OK;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_parse_url_path(struct Curl_easy *data,
                                   struct connectdata *conn)
{
  struct smb_request *req = data->req.p.smb;
  struct smb_conn *smbc = &conn->proto.smbc;
  char *path;
  char *slash;

  /* URL decode the path */
  CURLcode result = Curl_urldecode(data->state.up.path, 0, &path, NULL,
                                   REJECT_CTRL);
  if(result)
    return result;

  /* Parse the path for the share */
  smbc->share = strdup((*path == '/' || *path == '\\') ? path + 1 : path);
  free(path);
  if(!smbc->share)
    return CURLE_OUT_OF_MEMORY;

  slash = strchr(smbc->share, '/');
  if(!slash)
    slash = strchr(smbc->share, '\\');

  /* The share must be present */
  if(!slash) {
    Curl_safefree(smbc->share);
    failf(data, "missing share in URL path for SMB");
    return CURLE_URL_MALFORMAT;
  }

  /* Parse the path for the file path converting any forward slashes into
     backslashes */
  *slash++ = 0;
  req->path = slash;

  for(; *slash; slash++) {
    if(*slash == '/')
      *slash = '\\';
  }
  return CURLE_OK;
}